

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Value_List find_and_set_other_lines_with_same(Am_Object *script_line_part,Am_Object *scroll_menu)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  void *this;
  Am_Object *in_RDX;
  Am_List_Item *extraout_RDX;
  Am_Value_List AVar4;
  undefined1 local_78 [8];
  Am_Value_List items;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object script_line_group;
  Am_Object local_38;
  Am_Object not_part;
  Am_Value target_value;
  Am_Object *scroll_menu_local;
  Am_Object *script_line_part_local;
  Am_Value_List *ret_list;
  
  Am_Value::Am_Value((Am_Value *)&not_part);
  Am_Object::Am_Object(&local_38);
  Am_Object::Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&Am_Script_List_Header);
  bVar1 = Am_Object::Is_Instance_Of(scroll_menu,&local_58);
  Am_Object::~Am_Object(&local_58);
  if (bVar1) {
    Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)scroll_menu);
    Am_Object::operator=(&local_38,&local_60);
    Am_Object::~Am_Object(&local_60);
    pAVar2 = Am_Object::Get(&local_38,0x169,0);
    Am_Value::operator=((Am_Value *)&not_part,pAVar2);
  }
  else {
    pAVar2 = Am_Object::Get(scroll_menu,0x169,0);
    Am_Value::operator=((Am_Value *)&not_part,pAVar2);
    Am_Object::operator=(&local_38,scroll_menu);
  }
  items.item._7_1_ = 0;
  Am_Value_List::Am_Value_List((Am_Value_List *)script_line_part);
  value = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Value_List::Add((Am_Value_List *)script_line_part,value,Am_TAIL,true);
  set_text_leaf_parts(&local_38,&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Get(in_RDX,0xa2,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_78,pAVar2);
  Am_Value_List::Start((Am_Value_List *)local_78);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_78);
    Am_Object::operator=(&local_50,pAVar2);
    find_and_set_sub_lines
              ((Am_Value *)&not_part,&local_50,&local_38,(Am_Value_List *)script_line_part);
    Am_Value_List::Next((Am_Value_List *)local_78);
  }
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"final sel_list is ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)script_line_part);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  items.item._7_1_ = 1;
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_78);
  if ((items.item._7_1_ & 1) == 0) {
    Am_Value_List::~Am_Value_List((Am_Value_List *)script_line_part);
  }
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value((Am_Value *)&not_part);
  AVar4.item = extraout_RDX;
  AVar4.data = (Am_Value_List_Data *)script_line_part;
  return AVar4;
}

Assistant:

Am_Value_List
find_and_set_other_lines_with_same(Am_Object &script_line_part,
                                   Am_Object &scroll_menu)
{
  Am_Value target_value;
  Am_Object not_part, script_line_group;
  if (script_line_part.Is_Instance_Of(Am_Script_List_Header)) {
    not_part = script_line_part.Get_Owner(); //the group
    target_value = not_part.Get(Am_VALUE);
  } else {
    target_value = script_line_part.Get(Am_VALUE);
    not_part = script_line_part;
  }
  Am_Value_List ret_list;
  ret_list.Add(not_part); //the main one should be first
  set_text_leaf_parts(not_part, Am_Motif_Light_Green);
  Am_Value_List items = scroll_menu.Get(Am_ITEMS);
  for (items.Start(); !items.Last(); items.Next()) {
    script_line_group = items.Get();
    find_and_set_sub_lines(target_value, script_line_group, not_part, ret_list);
  }
  if (am_sdebug)
    std::cout << "final sel_list is " << ret_list << std::endl << std::flush;
  return ret_list;
}